

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ImGuiTabItem *pIVar5;
  ImGuiTabItem *__dest;
  ImGuiShrinkWidthItem *pIVar6;
  int *piVar7;
  long lVar8;
  ImGuiTabBar *in_RDI;
  ImVector<ImGuiShrinkWidthItem> *this;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float width_excess_00;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 IVar16;
  ImGuiWindow *window;
  bool teleport;
  ImGuiTabItem *tab_3;
  int tab_n_2;
  ImGuiTabBarSection *section_1;
  int section_n_3;
  float tab_offset;
  int section_tab_index;
  int section_n_2;
  float shrinked_width;
  ImGuiTabItem *tab_2;
  int tab_n_1;
  int shrink_data_offset;
  int shrink_data_count;
  float width_excess;
  bool central_section_is_visible;
  float section_2_w;
  float section_1_w;
  float section_0_w;
  ImGuiTabItem *scroll_and_select_tab;
  int section_n_1;
  ImGuiShrinkWidthItem *shrink_width_item;
  ImGuiTabBarSection *section;
  int section_n;
  bool has_close_button_or_unsaved_marker;
  char *tab_name;
  ImGuiTabItem *tab_1;
  int tab_n;
  bool found_selected_tab_id;
  int curr_section_n;
  ImGuiTabItem *most_recently_selected_tab;
  int shrink_buffer_indexes [3];
  ImGuiTabItem *tab_to_select;
  bool tab_list_popup_button;
  ImGuiID scroll_to_tab_id;
  int prev_tab_section_n;
  ImGuiTabItem *prev_tab;
  int curr_tab_section_n;
  ImGuiTabItem *tab;
  int tab_src_n;
  ImGuiTabBarSection sections [3];
  bool need_sort_by_section;
  int tab_dst_n;
  ImGuiContext *g;
  float in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe3c;
  float in_stack_fffffffffffffe40;
  undefined3 uVar17;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  void *in_stack_fffffffffffffe50;
  ImGuiTabBar *this_00;
  undefined4 in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe5c;
  float in_stack_fffffffffffffe60;
  float in_stack_fffffffffffffe64;
  float in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  float local_188;
  ImGuiID in_stack_fffffffffffffe7c;
  int *local_160;
  ImVec2 in_stack_fffffffffffffea8;
  ImGuiTabBar *in_stack_fffffffffffffeb0;
  ImGuiWindow *pIVar18;
  int local_134;
  int local_124;
  float local_120;
  int local_11c;
  ImGuiTabBar *in_stack_fffffffffffffef0;
  int local_108;
  float local_fc;
  int local_dc;
  float local_c4;
  int local_a4;
  int local_9c;
  ImGuiTabItem *local_98;
  int local_8c [3];
  ImGuiTabItem *local_80;
  undefined1 local_71;
  ImGuiID local_70;
  int local_6c;
  ImGuiTabItem *local_68;
  int local_5c;
  ImGuiTabItem *local_58;
  int local_4c;
  int local_48;
  float local_44 [5];
  int local_30;
  float local_2c;
  float local_28;
  int aiStack_24 [3];
  byte local_15;
  int local_14;
  ImGuiContext *local_10;
  ImGuiTabBar *local_8;
  
  local_10 = GImGui;
  in_RDI->WantLayout = false;
  local_14 = 0;
  local_15 = 0;
  local_160 = &local_48;
  local_8 = in_RDI;
  do {
    ImGuiTabBarSection::ImGuiTabBarSection((ImGuiTabBarSection *)0x50cc48);
    local_160 = local_160 + 3;
  } while (local_160 != aiStack_24);
  for (local_4c = 0; local_4c < (local_8->Tabs).Size; local_4c = local_4c + 1) {
    local_58 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,local_4c);
    if ((local_58->LastFrameVisible < local_8->PrevFrameVisible) ||
       ((local_58->WantClose & 1U) != 0)) {
      if (local_8->VisibleTabId == local_58->ID) {
        local_8->VisibleTabId = 0;
      }
      if (local_8->SelectedTabId == local_58->ID) {
        local_8->SelectedTabId = 0;
      }
      if (local_8->NextSelectedTabId == local_58->ID) {
        local_8->NextSelectedTabId = 0;
      }
    }
    else {
      if (local_14 != local_4c) {
        pIVar5 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,local_4c);
        __dest = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,local_14);
        memcpy(__dest,pIVar5,0x29);
      }
      local_58 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,local_14);
      local_58->IndexDuringLayout = (ImS16)local_14;
      local_5c = TabItemGetSectionIdx(local_58);
      if (0 < local_14) {
        local_68 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,local_14 + -1);
        local_6c = TabItemGetSectionIdx(local_68);
        if ((local_5c == 0) && (local_6c != 0)) {
          local_15 = 1;
        }
        if ((local_6c == 2) && (local_5c != 2)) {
          local_15 = 1;
        }
      }
      (&local_48)[(long)local_5c * 3] = (&local_48)[(long)local_5c * 3] + 1;
      local_14 = local_14 + 1;
    }
  }
  if ((local_8->Tabs).Size != local_14) {
    ImVector<ImGuiTabItem>::resize
              ((ImVector<ImGuiTabItem> *)
               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (int)in_stack_fffffffffffffe3c);
  }
  if ((local_15 & 1) != 0) {
    ImQsort(in_stack_fffffffffffffe50,CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
            CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
            (_func_int_void_ptr_void_ptr *)
            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  if ((local_48 < 1) || ((int)local_44[2] + local_30 < 1)) {
    fVar14 = 0.0;
  }
  else {
    fVar14 = (local_10->Style).ItemInnerSpacing.x;
  }
  if (((int)local_44[2] < 1) || (local_30 < 1)) {
    fVar15 = 0.0;
  }
  else {
    fVar15 = (local_10->Style).ItemInnerSpacing.x;
  }
  local_70 = 0;
  if (local_8->NextSelectedTabId != 0) {
    local_8->SelectedTabId = local_8->NextSelectedTabId;
    local_8->NextSelectedTabId = 0;
    local_70 = local_8->SelectedTabId;
  }
  local_44[1] = fVar14;
  local_44[4] = fVar15;
  if (local_8->ReorderRequestTabId != 0) {
    bVar2 = TabBarProcessReorder((ImGuiTabBar *)in_stack_fffffffffffffea8);
    if ((bVar2) && (local_8->ReorderRequestTabId == local_8->SelectedTabId)) {
      local_70 = local_8->ReorderRequestTabId;
    }
    local_8->ReorderRequestTabId = 0;
  }
  local_71 = (local_8->Flags & 4U) != 0;
  if (((bool)local_71) &&
     (local_80 = TabBarTabListPopupButton(in_stack_fffffffffffffeb0),
     local_80 != (ImGuiTabItem *)0x0)) {
    local_70 = local_80->ID;
    local_8->SelectedTabId = local_70;
  }
  local_8c[0] = 0;
  local_8c[1] = local_48 + local_30;
  local_8c[2] = local_48;
  ImVector<ImGuiShrinkWidthItem>::resize
            ((ImVector<ImGuiShrinkWidthItem> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (int)in_stack_fffffffffffffe3c);
  local_98 = (ImGuiTabItem *)0x0;
  local_9c = -1;
  bVar2 = false;
  for (local_a4 = 0; local_a4 < (local_8->Tabs).Size; local_a4 = local_a4 + 1) {
    pIVar5 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,local_a4);
    if (((local_98 == (ImGuiTabItem *)0x0) ||
        (local_98->LastFrameSelected < pIVar5->LastFrameSelected)) &&
       ((pIVar5->Flags & 0x200000U) == 0)) {
      local_98 = pIVar5;
    }
    if (pIVar5->ID == local_8->SelectedTabId) {
      bVar2 = true;
    }
    if ((local_70 == 0) && (local_10->NavJustMovedToId == pIVar5->ID)) {
      local_70 = pIVar5->ID;
    }
    ImGuiTabBar::GetTabName(local_8,pIVar5);
    uVar17 = (undefined3)in_stack_fffffffffffffe7c;
    in_stack_fffffffffffffe7c = CONCAT13(1,uVar17);
    if ((pIVar5->Flags & 0x100000U) != 0) {
      in_stack_fffffffffffffe7c = CONCAT13((pIVar5->Flags & 1U) != 0,uVar17);
    }
    if (pIVar5->RequestedWidth < 0.0) {
      IVar16 = TabItemCalcSize((char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
                               ,SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0));
      local_c4 = IVar16.x;
      local_188 = local_c4;
    }
    else {
      local_188 = pIVar5->RequestedWidth;
    }
    pIVar5->ContentWidth = local_188;
    iVar3 = TabItemGetSectionIdx(pIVar5);
    in_stack_fffffffffffffe74 = pIVar5->ContentWidth;
    if (iVar3 == local_9c) {
      in_stack_fffffffffffffe70 = (local_10->Style).ItemInnerSpacing.x;
    }
    else {
      in_stack_fffffffffffffe70 = 0.0;
    }
    local_44[(long)iVar3 * 3] =
         in_stack_fffffffffffffe74 + in_stack_fffffffffffffe70 + local_44[(long)iVar3 * 3];
    this = &local_10->ShrinkWidthBuffer;
    iVar4 = local_8c[iVar3];
    local_8c[iVar3] = iVar4 + 1;
    pIVar6 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar4);
    pIVar6->Index = local_a4;
    fVar9 = pIVar5->ContentWidth;
    pIVar6->InitialWidth = fVar9;
    pIVar6->Width = fVar9;
    fVar9 = ImMax<float>(pIVar5->ContentWidth,1.0);
    pIVar5->Width = fVar9;
    local_9c = iVar3;
  }
  local_8->WidthAllTabsIdeal = 0.0;
  for (local_dc = 0; local_dc < 3; local_dc = local_dc + 1) {
    local_8->WidthAllTabsIdeal =
         local_44[(long)local_dc * 3] + local_44[(long)local_dc * 3 + 1] +
         local_8->WidthAllTabsIdeal;
  }
  fVar9 = local_8->WidthAllTabsIdeal;
  fVar10 = ImRect::GetWidth(&local_8->BarRect);
  if (((fVar10 < fVar9) && (1 < (local_8->Tabs).Size)) &&
     (((local_8->Flags & 0x10U) == 0 &&
      ((((local_8->Flags & 0x80U) != 0 &&
        (pIVar5 = TabBarScrollingButtons(in_stack_fffffffffffffef0), pIVar5 != (ImGuiTabItem *)0x0))
       && (local_70 = pIVar5->ID, (pIVar5->Flags & 0x200000U) == 0)))))) {
    local_8->SelectedTabId = local_70;
  }
  fVar10 = local_44[0] + local_44[1];
  fVar11 = local_44[3] + local_44[4];
  fVar12 = local_2c + local_28;
  width_excess_00 = fVar10 + fVar12;
  fVar13 = ImRect::GetWidth(&local_8->BarRect);
  bVar1 = fVar13 <= width_excess_00;
  if (bVar1) {
    in_stack_fffffffffffffe60 = fVar10 + fVar12;
    local_fc = ImRect::GetWidth(&local_8->BarRect);
    local_fc = in_stack_fffffffffffffe60 - local_fc;
  }
  else {
    fVar13 = ImRect::GetWidth(&local_8->BarRect);
    local_fc = ImMax<float>(fVar11 - ((fVar13 - fVar10) - fVar12),0.0);
    in_stack_fffffffffffffe64 = fVar11;
  }
  if ((1.0 <= local_fc) && (((local_8->Flags & 0x40U) != 0 || (bVar1)))) {
    if (bVar1) {
      fVar10 = (float)(local_48 + local_30);
      iVar3 = 0;
    }
    else {
      iVar3 = local_48 + local_30;
      fVar10 = local_44[2];
    }
    in_stack_fffffffffffffe5c = fVar10;
    ShrinkWidths((ImGuiShrinkWidthItem *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),(int)fVar9,
                 width_excess_00);
    for (local_108 = iVar3; local_108 < iVar3 + (int)fVar10; local_108 = local_108 + 1) {
      this_00 = local_8;
      pIVar6 = ImVector<ImGuiShrinkWidthItem>::operator[](&local_10->ShrinkWidthBuffer,local_108);
      pIVar5 = ImVector<ImGuiTabItem>::operator[](&this_00->Tabs,pIVar6->Index);
      pIVar6 = ImVector<ImGuiShrinkWidthItem>::operator[](&local_10->ShrinkWidthBuffer,local_108);
      if (0.0 <= (float)(int)pIVar6->Width) {
        fVar9 = ImMax<float>(1.0,(float)(int)pIVar6->Width);
        iVar4 = TabItemGetSectionIdx(pIVar5);
        local_44[(long)iVar4 * 3] = local_44[(long)iVar4 * 3] - (pIVar5->Width - fVar9);
        pIVar5->Width = fVar9;
      }
    }
  }
  local_11c = 0;
  local_120 = 0.0;
  local_8->WidthAllTabs = 0.0;
  for (local_124 = 0; local_124 < 3; local_124 = local_124 + 1) {
    lVar8 = (long)local_124;
    piVar7 = &local_48 + lVar8 * 3;
    if (local_124 == 2) {
      fVar9 = ImRect::GetWidth(&local_8->BarRect);
      fVar9 = ImMax<float>(0.0,fVar9 - local_44[lVar8 * 3]);
      local_120 = ImMin<float>(fVar9,local_120);
    }
    for (local_134 = 0; local_134 < *piVar7; local_134 = local_134 + 1) {
      pIVar5 = ImVector<ImGuiTabItem>::operator[](&local_8->Tabs,local_11c + local_134);
      pIVar5->Offset = local_120;
      if (local_134 < *piVar7 + -1) {
        fVar9 = (local_10->Style).ItemInnerSpacing.x;
      }
      else {
        fVar9 = 0.0;
      }
      local_120 = pIVar5->Width + fVar9 + local_120;
    }
    fVar9 = ImMax<float>(local_44[lVar8 * 3] + local_44[lVar8 * 3 + 1],0.0);
    local_8->WidthAllTabs = fVar9 + local_8->WidthAllTabs;
    local_120 = local_44[lVar8 * 3 + 1] + local_120;
    local_11c = *piVar7 + local_11c;
  }
  if (!bVar2) {
    local_8->SelectedTabId = 0;
  }
  if (((local_8->SelectedTabId == 0) && (local_8->NextSelectedTabId == 0)) &&
     (local_98 != (ImGuiTabItem *)0x0)) {
    local_70 = local_98->ID;
    local_8->SelectedTabId = local_70;
  }
  local_8->VisibleTabId = local_8->SelectedTabId;
  local_8->VisibleTabWasSubmitted = false;
  if (local_70 != 0) {
    TabBarScrollToTab((ImGuiTabBar *)CONCAT44(fVar14,fVar15),in_stack_fffffffffffffe7c,
                      (ImGuiTabBarSection *)
                      CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  }
  fVar14 = TabBarScrollClamp((ImGuiTabBar *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                             in_stack_fffffffffffffe3c);
  local_8->ScrollingAnim = fVar14;
  fVar14 = TabBarScrollClamp((ImGuiTabBar *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                             in_stack_fffffffffffffe3c);
  local_8->ScrollingTarget = fVar14;
  if ((local_8->ScrollingAnim != local_8->ScrollingTarget) ||
     (NAN(local_8->ScrollingAnim) || NAN(local_8->ScrollingTarget))) {
    fVar14 = ImMax<float>(local_8->ScrollingSpeed,local_10->FontSize * 70.0);
    local_8->ScrollingSpeed = fVar14;
    fVar14 = ImMax<float>(local_8->ScrollingSpeed,
                          ABS(local_8->ScrollingTarget - local_8->ScrollingAnim) / 0.3);
    local_8->ScrollingSpeed = fVar14;
    uVar17 = (undefined3)in_stack_fffffffffffffe44;
    in_stack_fffffffffffffe44 = CONCAT13(1,uVar17);
    if (local_10->FrameCount <= local_8->PrevFrameVisible + 1) {
      in_stack_fffffffffffffe44 =
           CONCAT13(local_10->FontSize * 10.0 < local_8->ScrollingTargetDistToVisibility,uVar17);
    }
    if ((char)((uint)in_stack_fffffffffffffe44 >> 0x18) == '\0') {
      in_stack_fffffffffffffe40 =
           ImLinearSweep(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                         in_stack_fffffffffffffe38);
    }
    else {
      in_stack_fffffffffffffe40 = local_8->ScrollingTarget;
    }
    local_8->ScrollingAnim = in_stack_fffffffffffffe40;
  }
  else {
    local_8->ScrollingSpeed = 0.0;
  }
  local_8->ScrollingRectMinX = (local_8->BarRect).Min.x + local_44[0] + local_44[1];
  local_8->ScrollingRectMaxX = ((local_8->BarRect).Max.x - local_2c) - local_44[4];
  if ((local_8->Flags & 0x100000U) == 0) {
    ImVector<char>::resize
              ((ImVector<char> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (int)in_stack_fffffffffffffe3c);
  }
  pIVar18 = local_10->CurrentWindow;
  (pIVar18->DC).CursorPos = (local_8->BarRect).Min;
  fVar14 = local_8->WidthAllTabs;
  fVar15 = ImRect::GetHeight(&local_8->BarRect);
  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffea8,fVar14,fVar15);
  ItemSize((ImVec2 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
           in_stack_fffffffffffffe5c);
  fVar14 = ImMax<float>((pIVar18->DC).IdealMaxPos.x,
                        (local_8->BarRect).Min.x + local_8->WidthAllTabsIdeal);
  (pIVar18->DC).IdealMaxPos.x = fVar14;
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = TabItemGetSectionIdx(tab);
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = TabItemGetSectionIdx(prev_tab);
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_to_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_to_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_to_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_to_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_to_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_to_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button_or_unsaved_marker = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) == 0 || (tab->Flags & ImGuiTabItemFlags_UnsavedDocument);
        tab->ContentWidth = (tab->RequestedWidth >= 0.0f) ? tab->RequestedWidth : TabItemCalcSize(tab_name, has_close_button_or_unsaved_marker).x;

        int section_n = TabItemGetSectionIdx(tab);
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        IM_MSVC_WARNING_SUPPRESS(6385);
        ImGuiShrinkWidthItem* shrink_width_item = &g.ShrinkWidthBuffer[shrink_buffer_indexes[section_n]++];
        shrink_width_item->Index = tab_n;
        shrink_width_item->Width = shrink_width_item->InitialWidth = tab->ContentWidth;
        tab->Width = ImMax(tab->ContentWidth, 1.0f);
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_and_select_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_to_tab_id = scroll_and_select_tab->ID;
            if ((scroll_and_select_tab->Flags & ImGuiTabItemFlags_Button) == 0)
                tab_bar->SelectedTabId = scroll_to_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess >= 1.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            shrinked_width = ImMax(1.0f, shrinked_width);
            int section_n = TabItemGetSectionIdx(tab);
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_to_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_to_tab_id != 0)
        TabBarScrollToTab(tab_bar, scroll_to_tab_id, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabs, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}